

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall Minisat::SimpSolver::addClause_(SimpSolver *this,vec<Minisat::Lit> *ps)

{
  uint64_t *puVar1;
  ulong *puVar2;
  int *piVar3;
  int iVar4;
  uint elem;
  FILE *drup_file;
  uint *puVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  CRef cr;
  uint local_34;
  
  iVar7 = (this->super_Solver).clauses.sz;
  if ((this->use_rcheck == true) && (bVar6 = implied(this,ps), bVar6)) {
    return true;
  }
  if ((this->parsing == false) &&
     (drup_file = (this->super_Solver).drup_file, drup_file != (FILE *)0x0)) {
    Solver::binDRUP<Minisat::vec<Minisat::Lit>>(&this->super_Solver,'a',ps,drup_file);
  }
  bVar6 = Solver::addClause_(&this->super_Solver,ps);
  if (bVar6) {
    bVar6 = true;
    if (((this->use_simplification == true) &&
        (iVar4 = (this->super_Solver).clauses.sz, iVar4 == iVar7 + 1)) &&
       ((this->super_Solver).solves == 0)) {
      elem = (this->super_Solver).clauses.data[(long)iVar4 + -1];
      puVar5 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
      puVar1 = &(this->super_Solver).statistics.simpSteps;
      *puVar1 = *puVar1 + 1;
      Queue<unsigned_int>::insert(&this->subsumption_queue,elem);
      if (*(ulong *)(puVar5 + elem) >> 0x22 != 0) {
        puVar2 = (ulong *)(puVar5 + elem);
        uVar8 = 0;
        do {
          vec<unsigned_int>::push
                    ((this->occurs).occs.data + (*(int *)((long)puVar2 + uVar8 * 4 + 8) >> 1),
                     &local_34);
          piVar3 = (this->n_occ).data + *(int *)((long)puVar2 + uVar8 * 4 + 8);
          *piVar3 = *piVar3 + 1;
          (this->touched).data[*(int *)((long)puVar2 + uVar8 * 4 + 8) >> 1] = '\x01';
          this->n_touched = this->n_touched + 1;
          iVar7 = *(int *)((long)puVar2 + uVar8 * 4 + 8) >> 1;
          if ((iVar7 < (this->elim_heap).indices.sz) && (-1 < (this->elim_heap).indices.data[iVar7])
             ) {
            Heap<Minisat::SimpSolver::ElimLt>::percolateDown
                      (&this->elim_heap,(this->elim_heap).indices.data[iVar7]);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < *puVar2 >> 0x22);
      }
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool SimpSolver::addClause_(vec<Lit> &ps)
{
#ifndef NDEBUG
    bool is_sat = false;
    bool has_eliminated = false;
    for (int i = 0; i < ps.size(); i++) {
        if (value(ps[i]) == l_True) is_sat = true;
        if (isEliminated(var(ps[i]))) has_eliminated = true;
    }
    assert((is_sat || !has_eliminated) && "removing clauses is done lazily");
#endif

    int nclauses = clauses.size();

    if (use_rcheck && implied(ps)) return true;

    if (!parsing && drup_file) {
#ifdef BIN_DRUP
        binDRUP('a', ps, drup_file);
#else
        for (int i = 0; i < ps.size(); i++) fprintf(drup_file, "%i ", (var(ps[i]) + 1) * (-2 * sign(ps[i]) + 1));
        fprintf(drup_file, "0\n");
#endif
    }

    if (!Solver::addClause_(ps)) return false;

    // Only simplify before actually solving
    if (use_simplification && clauses.size() == nclauses + 1 && solves == 0) {
        CRef cr = clauses.last();
        const Clause &c = ca[cr];
        statistics.simpSteps++;

        // NOTE: the clause is added to the queue immediately and then
        // again during 'gatherTouchedClauses()'. If nothing happens
        // in between, it will only be checked once. Otherwise, it may
        // be checked twice unnecessarily. This is an unfortunate
        // consequence of how backward subsumption is used to mimic
        // forward subsumption.
        subsumption_queue.insert(cr);
        for (int i = 0; i < c.size(); i++) {
            occurs[var(c[i])].push(cr);
            n_occ[toInt(c[i])]++;
            touched[var(c[i])] = 1;
            n_touched++;
            if (elim_heap.inHeap(var(c[i]))) elim_heap.increase(var(c[i]));
        }
    }

    return true;
}